

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

int __thiscall ON_wString::RemoveWhiteSpace(ON_wString *this,wchar_t *whitespace)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ON_Internal_Empty_wString *pOVar6;
  int *piVar7;
  int iVar8;
  wchar_t *pwVar9;
  long lVar10;
  
  pwVar5 = this->m_s;
  iVar2 = 0;
  if (pwVar5 != (wchar_t *)0x0) {
    pwVar4 = pwVar5 + pwVar5[-2];
    if ((whitespace == (wchar_t *)0x0) || (pwVar3 = pwVar5, *whitespace == L'\0')) {
      lVar10 = 0;
      do {
        if (pwVar4 <= pwVar5) {
          return 0;
        }
        wVar1 = *pwVar5;
        lVar10 = lVar10 + 0x100000000;
      } while ((wVar1 != L'\x7f') && (pwVar5 = pwVar5 + 1, 0x1f < (uint)(wVar1 + L'\xffffffff')));
      CopyArray(this);
      pwVar5 = this->m_s;
      lVar10 = lVar10 >> 0x20;
      pwVar4 = pwVar5 + lVar10 + -1;
      pOVar6 = &empty_wstring;
      if (pwVar5 != (wchar_t *)0x0) {
        pOVar6 = (ON_Internal_Empty_wString *)(pwVar5 + -3);
      }
      iVar8 = (pOVar6->header).string_length;
      piVar7 = &(pOVar6->header).string_length;
      pwVar3 = pwVar5 + iVar8;
      if (lVar10 < iVar8) {
        pwVar5 = pwVar5 + lVar10;
        do {
          wVar1 = *pwVar5;
          if ((wVar1 < L'\x01') || (wVar1 != L'\x7f' && 0x20 < (uint)wVar1)) {
            *pwVar4 = wVar1;
            pwVar4 = pwVar4 + 1;
          }
          pwVar5 = pwVar5 + 1;
        } while (pwVar5 < pwVar3);
      }
    }
    else {
      do {
        if (pwVar4 <= pwVar3) {
          return 0;
        }
        pwVar9 = whitespace;
        do {
          wVar1 = *pwVar9;
          if (wVar1 == *pwVar3) break;
          pwVar9 = pwVar9 + 1;
        } while (wVar1 != L'\0');
        pwVar3 = pwVar3 + 1;
      } while (wVar1 == L'\0');
      CopyArray(this);
      pwVar9 = this->m_s;
      lVar10 = (long)(int)((ulong)((long)pwVar3 - (long)pwVar5) >> 2);
      pwVar4 = pwVar9 + lVar10 + -1;
      pOVar6 = &empty_wstring;
      if (pwVar9 != (wchar_t *)0x0) {
        pOVar6 = (ON_Internal_Empty_wString *)(pwVar9 + -3);
      }
      iVar8 = (pOVar6->header).string_length;
      piVar7 = &(pOVar6->header).string_length;
      pwVar3 = pwVar9 + iVar8;
      if (lVar10 < iVar8) {
        pwVar9 = pwVar9 + lVar10;
        do {
          pwVar5 = whitespace;
          do {
            wVar1 = *pwVar5;
            if (wVar1 == *pwVar9) break;
            pwVar5 = pwVar5 + 1;
          } while (wVar1 != L'\0');
          if (wVar1 == L'\0') {
            *pwVar4 = *pwVar9;
            pwVar4 = pwVar4 + 1;
          }
          pwVar9 = pwVar9 + 1;
        } while (pwVar9 < pwVar3);
      }
    }
    *pwVar4 = L'\0';
    iVar2 = (int)((ulong)((long)pwVar3 - (long)pwVar4) >> 2);
    *piVar7 = iVar8 - iVar2;
  }
  return iVar2;
}

Assistant:

int ON_wString::RemoveWhiteSpace( const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  wchar_t* s;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          if ( !IsWhiteSpaceHelper(*s0,whitespace) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s = s0-1;
        s1 = m_s + Length();
        while ( s0 < s1 )
        {
          c = *s0;
          if ( c < 1 || (c > 32 && 127 != c) )
          {
            *s++ = *s0;
          }
          s0++;
        }
        *s = 0;
        n = ((int)(s1 - s)); // keep win64 happy with (int) cast
        Header()->string_length -= n;
        return n;
      }
    }
  }
  return 0;
}